

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

Aig_Obj_t * Aig_ObjReal_rec(Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  
  if ((*(uint *)(((ulong)pObj & 0xfffffffffffffffe) + 0x18) & 7) == 4) {
    pAVar1 = Aig_ObjReal_rec(*(Aig_Obj_t **)(((ulong)pObj & 0xfffffffffffffffe) + 8));
    pObj = (Aig_Obj_t *)((ulong)((uint)pObj & 1) ^ (ulong)pAVar1);
  }
  return pObj;
}

Assistant:

Aig_Obj_t * Aig_ObjReal_rec( Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew, * pObjR = Aig_Regular(pObj);
    if ( !Aig_ObjIsBuf(pObjR) )
        return pObj;
    pObjNew = Aig_ObjReal_rec( Aig_ObjChild0(pObjR) );
    return Aig_NotCond( pObjNew, Aig_IsComplement(pObj) );
}